

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

int tcv_init(tcv_t *tcv)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint8_t local_19;
  int ret;
  uint8_t identifier;
  tcv_t *tcv_local;
  
  _ret = tcv;
  _Var1 = tcv_check_and_lock_ok(tcv);
  if (_Var1) {
    iVar2 = (*_ret->read)(_ret->index,'P','\0',&local_19,1);
    if (iVar2 < 0) {
      tcv_unlock(_ret);
      tcv_local._4_4_ = iVar2;
    }
    else {
      if (_ret->data != (void *)0x0) {
        free(_ret->data);
        _ret->data = (void *)0x0;
      }
      if (local_19 == '\x03') {
        iVar2 = sfp_init(_ret);
        iVar3 = tcv_unlock(_ret);
        tcv_local._4_4_ = iVar2;
        if (iVar3 != 0) {
          tcv_local._4_4_ = -1;
        }
      }
      else {
        tcv_local._4_4_ = -1;
      }
    }
  }
  else {
    tcv_local._4_4_ = -4;
  }
  return tcv_local._4_4_;
}

Assistant:

int tcv_init(tcv_t *tcv)
{
	uint8_t identifier;
	int ret = 0;

	if (!tcv_check_and_lock_ok(tcv))
		return TCV_ERR_INVALID_ARG;

	ret = tcv->read(tcv->index, TCV_DEVADDR_A0, TCV_IDENTIFIER, &identifier, 1);
	if (ret < 0) {
		tcv_unlock(tcv);
		return ret;
	}

	/* if someone calls init on a transceiver with alloc'ed data - clear it first */
	if (tcv->data) {
		free(tcv->data);
		tcv->data = NULL;
	}

	switch (identifier) {
		case TCV_TYPE_SFP:
			ret = sfp_init(tcv);
			break;

//		TODO
//		case TCV_TYPE_XFP:
//			((sfp_data_t*)tcv->data) = malloc(sizeof(xfp_data_t));
//			((xfp_data_t*)((sfp_data_t*)tcv->data))->type = TCV_TYPE_XFP;
//			break;

		default:
			return TCV_ERR_GENERIC;
	}
	if (tcv_unlock(tcv))
		return TCV_ERR_GENERIC;

	return ret;
}